

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::avx::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  RTCRayQueryContext RVar1;
  RTCFormat RVar2;
  InstanceArray *this;
  RTCRayQueryContext *pRVar3;
  RawBufferView *pRVar4;
  char *pcVar5;
  RawBufferView *pRVar6;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  float fVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  Accel *pAVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  vfloat4 a0_1;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vfloat4 a0;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_ZMM4 [64];
  float fVar78;
  vfloat4 b0;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 in_ZMM5 [64];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 in_ZMM6 [64];
  float fVar91;
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 in_ZMM7 [64];
  float fVar96;
  float fVar98;
  vfloat4 a1;
  undefined1 auVar97 [16];
  undefined1 in_ZMM9 [64];
  float fVar99;
  RayQueryContext newcontext;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_e8 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  auVar34 = in_ZMM7._0_16_;
  auVar42 = in_ZMM6._0_16_;
  a0.field_0 = in_ZMM4._0_16_;
  auVar41 = in_ZMM2._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  auVar33 = in_ZMM9._0_16_;
  auVar47 = in_ZMM1._0_16_;
  uVar17 = (ulong)prim->instID_;
  this = (InstanceArray *)(context->scene->geometries).items[uVar17].ptr;
  pAVar12 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (((pAVar12 == (Accel *)0x0) || ((ray->mask & (this->super_Geometry).mask) == 0)) ||
     (pRVar3 = context->user, pRVar3->instID[0] != 0xffffffff)) {
    return false;
  }
  auVar57._8_8_ = 0;
  auVar57._0_4_ = prim->primID_;
  auVar57._4_4_ = prim->instID_;
  auVar26 = vshufps_avx(auVar57,auVar57,0xe1);
  RVar1 = (RTCRayQueryContext)vmovlps_avx(auVar26);
  *pRVar3 = RVar1;
  uVar13 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar4 = (this->l2w_buf).items;
    RVar2 = pRVar4->format;
    if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
      if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x10)),0x1c);
        auVar26 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x20)),0x28);
        auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x14)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),0x28);
        auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),0x1c);
        auVar41 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x28)),0x28);
        auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x1c)),0x1c);
        auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x2c)),0x28);
      }
      else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(pcVar5 + lVar14 + 4);
        auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar20,0x4c);
        auVar26 = vshufps_avx(auVar47,auVar47,0x78);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
        auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),auVar43,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar47,auVar47,0x78);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
        auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar44,0x4c);
        auVar41 = vshufps_avx(auVar47,auVar47,0x78);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x28);
        auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),auVar45,0x4c);
        auVar47 = vshufps_avx(auVar47,auVar47,0x78);
      }
      else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
        auVar42 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),0x20);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x34);
        auVar47 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar23);
        auVar34 = vshufps_avx(auVar47,auVar23,0xd8);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
        auVar47 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar69);
        auVar41 = vshufps_avx(auVar47,auVar69,0xd8);
        fVar19 = *(float *)(pcVar5 + lVar14 + 0x24);
        fVar91 = *(float *)(pcVar5 + lVar14 + 0x28);
        fVar85 = *(float *)(pcVar5 + lVar14 + 0x2c);
        fVar88 = *(float *)(pcVar5 + lVar14 + 0x30);
        fVar93 = fVar88 * fVar88 + fVar85 * fVar85 + fVar19 * fVar19 + fVar91 * fVar91;
        auVar47 = vrsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
        fVar78 = auVar47._0_4_;
        fVar93 = fVar78 * 1.5 + fVar78 * fVar78 * fVar78 * fVar93 * -0.5;
        auVar47 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar93 * fVar19)),0x30);
        auVar26 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar93 * fVar91)),0x30);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),0x10);
        auVar41 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar93 * fVar88)),0x30);
        auVar42 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x3c)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar42,ZEXT416((uint)(fVar93 * fVar85)),0x30);
      }
      else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar26 = *(undefined1 (*) [16])(pcVar5 + lVar14);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar5 + lVar14 + 0x10))->v
        ;
        auVar41 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x20);
        auVar47 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x30);
      }
      goto LAB_010a06e3;
    }
    if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x10)),0x1c);
      auVar33 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x20)),0x28);
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x14)),0x1c);
      auVar42 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),0x28);
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),0x1c);
      auVar41 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x28)),0x28);
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x1c)),0x1c);
      auVar26 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x2c)),0x28);
    }
    else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(pcVar5 + lVar14 + 4);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar28,0x4c);
      auVar33 = vshufps_avx(auVar47,auVar47,0x78);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),auVar50,0x4c);
      auVar42 = vshufps_avx(auVar47,auVar47,0x78);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar51,0x4c);
      auVar41 = vshufps_avx(auVar47,auVar47,0x78);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x28);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),auVar52,0x4c);
      auVar26 = vshufps_avx(auVar47,auVar47,0x78);
    }
    else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
      auVar47 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),0x20);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x34);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar32);
      auVar34 = vshufps_avx(auVar42,auVar32,0xd8);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar74);
      auVar41 = vshufps_avx(auVar42,auVar74,0xd8);
      fVar19 = *(float *)(pcVar5 + lVar14 + 0x24);
      fVar91 = *(float *)(pcVar5 + lVar14 + 0x28);
      fVar85 = *(float *)(pcVar5 + lVar14 + 0x2c);
      fVar88 = *(float *)(pcVar5 + lVar14 + 0x30);
      fVar93 = fVar88 * fVar88 + fVar85 * fVar85 + fVar19 * fVar19 + fVar91 * fVar91;
      auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
      fVar78 = auVar42._0_4_;
      fVar93 = fVar78 * 1.5 + fVar78 * fVar78 * fVar78 * fVar93 * -0.5;
      auVar26 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar93 * fVar19)),0x30);
      auVar33 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar93 * fVar91)),0x30);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),0x10);
      auVar41 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar93 * fVar88)),0x30);
      auVar47 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x3c)),0x20);
      auVar42 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar93 * fVar85)),0x30);
    }
    else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar33 = *(undefined1 (*) [16])(pcVar5 + lVar14);
      auVar42 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x10);
      auVar41 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x20);
      auVar26 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x30);
    }
    auVar47 = vshufps_avx(auVar26,auVar26,0xff);
    auVar34 = vshufps_avx(auVar33,auVar33,0xff);
    auVar57 = vshufps_avx(auVar42,auVar42,0xff);
    auVar29 = vshufps_avx(auVar41,auVar41,0xff);
    fVar83 = auVar34._0_4_;
    fVar82 = auVar47._0_4_;
    fVar94 = auVar57._0_4_;
    fVar95 = auVar29._0_4_;
    fVar19 = fVar83 * fVar94 + fVar95 * fVar82;
    fVar88 = fVar83 * fVar94 - fVar95 * fVar82;
    fVar93 = fVar82 * fVar82 - fVar83 * fVar83;
    fVar78 = fVar83 * fVar95 - fVar94 * fVar82;
    fVar91 = fVar83 * fVar95 + fVar94 * fVar82;
    fVar85 = fVar94 * fVar95 + fVar83 * fVar82;
    fVar18 = fVar94 * fVar95 - fVar83 * fVar82;
    auVar47 = ZEXT416((uint)(-fVar95 * fVar95 + -fVar94 * fVar94 + fVar82 * fVar82 + fVar83 * fVar83
                            ));
    auVar47 = vshufps_avx(auVar47,auVar47,0);
    auVar34 = ZEXT416((uint)(fVar19 + fVar19));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar57 = ZEXT416((uint)(fVar78 + fVar78));
    auVar57 = vshufps_avx(auVar57,auVar57,0);
    fVar78 = auVar47._0_4_ * 1.0 + auVar34._0_4_ * 0.0 + auVar57._0_4_ * 0.0;
    fVar82 = auVar47._4_4_ * 0.0 + auVar34._4_4_ * 1.0 + auVar57._4_4_ * 0.0;
    fVar83 = auVar47._8_4_ * 0.0 + auVar34._8_4_ * 0.0 + auVar57._8_4_ * 1.0;
    fVar84 = auVar47._12_4_ * 0.0 + auVar34._12_4_ * 0.0 + auVar57._12_4_ * 0.0;
    auVar47 = ZEXT416((uint)(-fVar95 * fVar95 + fVar94 * fVar94 + fVar93));
    auVar47 = vshufps_avx(auVar47,auVar47,0);
    auVar34 = ZEXT416((uint)(fVar85 + fVar85));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar57 = ZEXT416((uint)(fVar88 + fVar88));
    auVar57 = vshufps_avx(auVar57,auVar57,0);
    fVar85 = auVar57._0_4_ * 1.0 + auVar47._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
    fVar88 = auVar57._4_4_ * 0.0 + auVar47._4_4_ * 1.0 + auVar34._4_4_ * 0.0;
    fVar89 = auVar57._8_4_ * 0.0 + auVar47._8_4_ * 0.0 + auVar34._8_4_ * 1.0;
    fVar90 = auVar57._12_4_ * 0.0 + auVar47._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
    auVar47 = ZEXT416((uint)(-fVar94 * fVar94 + fVar93 + fVar95 * fVar95));
    auVar34 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = ZEXT416((uint)(fVar18 + fVar18));
    auVar57 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = ZEXT416((uint)(fVar91 + fVar91));
    auVar29 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = vshufps_avx(auVar33,ZEXT416(0) << 0x20,0xe9);
    auVar47 = vblendps_avx(auVar47,auVar42,4);
    fVar91 = auVar29._0_4_ * 1.0 + auVar57._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
    fVar93 = auVar29._4_4_ * 0.0 + auVar57._4_4_ * 1.0 + auVar34._4_4_ * 0.0;
    fVar94 = auVar29._8_4_ * 0.0 + auVar57._8_4_ * 0.0 + auVar34._8_4_ * 1.0;
    fVar95 = auVar29._12_4_ * 0.0 + auVar57._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
    fVar18 = auVar47._0_4_;
    fVar96 = auVar47._4_4_;
    fVar98 = auVar47._8_4_;
    fVar19 = auVar47._12_4_;
    auVar47 = vshufps_avx(auVar33,auVar33,0);
    auVar35._0_4_ = auVar47._0_4_ * fVar78 + fVar91 * 0.0 + fVar85 * 0.0;
    auVar35._4_4_ = auVar47._4_4_ * fVar82 + fVar93 * 0.0 + fVar88 * 0.0;
    auVar35._8_4_ = auVar47._8_4_ * fVar83 + fVar94 * 0.0 + fVar89 * 0.0;
    auVar35._12_4_ = auVar47._12_4_ * fVar84 + fVar95 * 0.0 + fVar90 * 0.0;
    auVar47 = vshufps_avx(auVar42,auVar42,0);
    auVar42 = vshufps_avx(auVar42,auVar42,0x55);
    a0.field_0._0_4_ = auVar47._0_4_ * fVar78 + fVar91 * 0.0 + auVar42._0_4_ * fVar85;
    a0.field_0._4_4_ = auVar47._4_4_ * fVar82 + fVar93 * 0.0 + auVar42._4_4_ * fVar88;
    a0.field_0._8_4_ = auVar47._8_4_ * fVar83 + fVar94 * 0.0 + auVar42._8_4_ * fVar89;
    a0.field_0._12_4_ = auVar47._12_4_ * fVar84 + fVar95 * 0.0 + auVar42._12_4_ * fVar90;
    auVar47 = vshufps_avx(auVar41,auVar41,0x55);
    auVar42 = vshufps_avx(auVar41,auVar41,0xaa);
    auVar34 = vshufps_avx(auVar41,auVar41,0);
    auVar41._0_4_ = auVar34._0_4_ * fVar78 + auVar42._0_4_ * fVar91 + auVar47._0_4_ * fVar85;
    auVar41._4_4_ = auVar34._4_4_ * fVar82 + auVar42._4_4_ * fVar93 + auVar47._4_4_ * fVar88;
    auVar41._8_4_ = auVar34._8_4_ * fVar83 + auVar42._8_4_ * fVar94 + auVar47._8_4_ * fVar89;
    auVar41._12_4_ = auVar34._12_4_ * fVar84 + auVar42._12_4_ * fVar95 + auVar47._12_4_ * fVar90;
    auVar47 = vshufps_avx(auVar26,auVar26,0xaa);
    auVar42 = vshufps_avx(auVar26,auVar26,0x55);
    fVar91 = auVar42._0_4_ * fVar85 + auVar47._0_4_ * fVar91;
    fVar85 = auVar42._4_4_ * fVar88 + auVar47._4_4_ * fVar93;
    fVar88 = auVar42._8_4_ * fVar89 + auVar47._8_4_ * fVar94;
    fVar93 = auVar42._12_4_ * fVar90 + auVar47._12_4_ * fVar95;
    auVar42 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = auVar35;
  }
  else {
    fVar19 = (this->super_Geometry).fnumTimeSegments;
    fVar91 = (this->super_Geometry).time_range.lower;
    fVar85 = (this->super_Geometry).time_range.upper;
    auVar29 = ZEXT416((uint)fVar85);
    fVar91 = fVar19 * (((ray->dir).field_0.m128[3] - fVar91) / (fVar85 - fVar91));
    auVar47 = ZEXT416((uint)fVar91);
    auVar41 = vroundss_avx(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91),9);
    auVar41 = vminss_avx(auVar41,ZEXT416((uint)(fVar19 + -1.0)));
    auVar57 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar41 = vmaxss_avx(ZEXT816(0) << 0x20,auVar41);
    iVar15 = (int)auVar41._0_4_;
    lVar14 = CONCAT44((int)(uVar17 >> 0x20),iVar15);
    fVar91 = fVar91 - auVar41._0_4_;
    pRVar6 = (this->l2w_buf).items;
    pRVar4 = pRVar6 + lVar14;
    RVar2 = pRVar6[lVar14].format;
    auVar26 = ZEXT416((uint)fVar91);
    if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
      if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = pRVar4->stride * uVar13;
        auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x10)),0x1c);
        auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x20)),0x28);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x14)),0x1c);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),0x1c);
        auVar57 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x28)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x1c)),0x1c);
        auVar29 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x2c)),0x28);
      }
      else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = pRVar4->stride * uVar13;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(pcVar5 + lVar14 + 4);
        auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar21,0x4c);
        auVar47 = vshufps_avx(auVar47,auVar47,0x78);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
        auVar41 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),auVar46,0x4c);
        auVar41 = vshufps_avx(auVar41,auVar41,0x78);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar58,0x4c);
        auVar57 = vshufps_avx(auVar33,auVar33,0x78);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x28);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24));
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),auVar62,0x4c);
        auVar29 = vshufps_avx(auVar33,auVar33,0x78);
      }
      else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = pRVar4->stride * uVar13;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
        auVar41 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),0x20);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x34);
        auVar47 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar25);
        auVar33 = vshufps_avx(auVar47,auVar25,0xd8);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
        auVar47 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar63);
        auVar57 = vshufps_avx(auVar47,auVar63,0xd8);
        fVar19 = *(float *)(pcVar5 + lVar14 + 0x24);
        fVar85 = *(float *)(pcVar5 + lVar14 + 0x28);
        fVar88 = *(float *)(pcVar5 + lVar14 + 0x2c);
        auVar42 = ZEXT416((uint)fVar88);
        fVar93 = *(float *)(pcVar5 + lVar14 + 0x30);
        auVar34 = ZEXT416((uint)fVar93);
        fVar78 = fVar93 * fVar93 + fVar88 * fVar88 + fVar19 * fVar19 + fVar85 * fVar85;
        auVar47 = vrsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        fVar18 = auVar47._0_4_;
        fVar78 = fVar18 * 1.5 + fVar18 * fVar18 * fVar18 * fVar78 * -0.5;
        auVar29 = vinsertps_avx(auVar57,ZEXT416((uint)(fVar78 * fVar19)),0x30);
        auVar47 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar78 * fVar85)),0x30);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar78 * fVar88))
        ;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                                   ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),0x10);
        auVar57 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar78 * fVar93)),0x30);
        auVar41 = vinsertps_avx((undefined1  [16])a0.field_0,
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x3c)),0x20);
        auVar41 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar78 * fVar88)),0x30);
      }
      else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = pRVar4->stride * uVar13;
        auVar47 = *(undefined1 (*) [16])(pcVar5 + lVar14);
        auVar41 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x10);
        auVar57 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x20);
        auVar29 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x30);
      }
      pRVar4 = pRVar6 + (iVar15 + 1U);
      RVar2 = pRVar6[iVar15 + 1U].format;
      if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x10)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x20)),0x28);
        auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x14)),0x1c);
        auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),0x28);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),0x1c);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x28)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x1c)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x2c)),0x28);
      }
      else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)(pcVar5 + lVar14 + 4);
        auVar42 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar70,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar42,auVar42,0x78);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
        auVar42 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),auVar79,0x4c);
        auVar42 = vshufps_avx(auVar42,auVar42,0x78);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
        auVar34 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar80,0x4c);
        auVar34 = vshufps_avx(auVar34,auVar34,0x78);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x28);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),auVar81,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar33,auVar33,0x78);
      }
      else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
        auVar42 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),0x20);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x34);
        auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar72);
        auVar33 = vshufps_avx(auVar34,auVar72,0xd8);
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
        auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar97);
        auVar30 = vshufps_avx(auVar34,auVar97,0xd8);
        fVar19 = *(float *)(pcVar5 + lVar14 + 0x24);
        fVar85 = *(float *)(pcVar5 + lVar14 + 0x28);
        fVar88 = *(float *)(pcVar5 + lVar14 + 0x2c);
        fVar93 = *(float *)(pcVar5 + lVar14 + 0x30);
        fVar78 = fVar93 * fVar93 + fVar88 * fVar88 + fVar19 * fVar19 + fVar85 * fVar85;
        auVar34 = vrsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        fVar18 = auVar34._0_4_;
        fVar78 = fVar18 * 1.5 + fVar18 * fVar18 * fVar18 * fVar78 * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416((uint)(fVar19 * fVar78)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416((uint)(fVar85 * fVar78)),0x30);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),0x10);
        auVar34 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar93 * fVar78)),0x30);
        auVar42 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x3c)),0x20);
        auVar42 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar88 * fVar78)),0x30);
      }
      else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = uVar13 * pRVar4->stride;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar5 + lVar14))->v;
        auVar42 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x10);
        auVar34 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x20);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar5 + lVar14 + 0x30))->v
        ;
      }
      auVar33 = vshufps_avx(auVar26,auVar26,0);
      fVar93 = auVar33._0_4_;
      fVar78 = auVar33._4_4_;
      fVar18 = auVar33._8_4_;
      fVar82 = auVar33._12_4_;
      auVar33 = vshufps_avx(ZEXT416((uint)(1.0 - fVar91)),ZEXT416((uint)(1.0 - fVar91)),0);
      fVar19 = auVar33._0_4_;
      fVar91 = auVar33._4_4_;
      fVar85 = auVar33._8_4_;
      fVar88 = auVar33._12_4_;
      auVar26._0_4_ = fVar19 * auVar47._0_4_ + fVar93 * a0.field_0._0_4_;
      auVar26._4_4_ = fVar91 * auVar47._4_4_ + fVar78 * a0.field_0._4_4_;
      auVar26._8_4_ = fVar85 * auVar47._8_4_ + fVar18 * a0.field_0._8_4_;
      auVar26._12_4_ = fVar88 * auVar47._12_4_ + fVar82 * a0.field_0._12_4_;
      a0.field_0._0_4_ = fVar19 * auVar41._0_4_ + fVar93 * auVar42._0_4_;
      a0.field_0._4_4_ = fVar91 * auVar41._4_4_ + fVar78 * auVar42._4_4_;
      a0.field_0._8_4_ = fVar85 * auVar41._8_4_ + fVar18 * auVar42._8_4_;
      a0.field_0._12_4_ = fVar88 * auVar41._12_4_ + fVar82 * auVar42._12_4_;
      auVar41._0_4_ = fVar19 * auVar57._0_4_ + fVar93 * auVar34._0_4_;
      auVar41._4_4_ = fVar91 * auVar57._4_4_ + fVar78 * auVar34._4_4_;
      auVar41._8_4_ = fVar85 * auVar57._8_4_ + fVar18 * auVar34._8_4_;
      auVar41._12_4_ = fVar88 * auVar57._12_4_ + fVar82 * auVar34._12_4_;
      auVar47._0_4_ = fVar19 * auVar29._0_4_ + fVar93 * b0.field_0._0_4_;
      auVar47._4_4_ = fVar91 * auVar29._4_4_ + fVar78 * b0.field_0._4_4_;
      auVar47._8_4_ = fVar85 * auVar29._8_4_ + fVar18 * b0.field_0._8_4_;
      auVar47._12_4_ = fVar88 * auVar29._12_4_ + fVar82 * b0.field_0._12_4_;
      goto LAB_010a06e3;
    }
    if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = pRVar4->stride * uVar13;
      auVar47 = ZEXT416(*(uint *)(pcVar5 + lVar14 + 8));
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x10)),0x1c);
      _local_158 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x20)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x14)),0x1c);
      _local_168 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),0x1c);
      _local_188 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x28)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x1c)),0x1c);
      _local_178 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x2c)),0x28);
    }
    else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = pRVar4->stride * uVar13;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(pcVar5 + lVar14 + 4);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar42,0x4c);
      _local_158 = vshufps_avx(auVar47,auVar47,0x78);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),auVar34,0x4c);
      _local_168 = vshufps_avx(auVar47,auVar47,0x78);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar29,0x4c);
      _local_188 = vshufps_avx(auVar47,auVar47,0x78);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x28);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),auVar30,0x4c);
      _local_178 = vshufps_avx(auVar47,auVar47,0x78);
      auVar47 = auVar57;
    }
    else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = pRVar4->stride * uVar13;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
      auVar47 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),0x20);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x34);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar53);
      auVar34 = vshufps_avx(auVar42,auVar53,0xd8);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar75);
      auVar41 = vshufps_avx(auVar42,auVar75,0xd8);
      fVar19 = *(float *)(pcVar5 + lVar14 + 0x24);
      fVar85 = *(float *)(pcVar5 + lVar14 + 0x28);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar85);
      fVar88 = *(float *)(pcVar5 + lVar14 + 0x2c);
      fVar93 = *(float *)(pcVar5 + lVar14 + 0x30);
      fVar78 = fVar93 * fVar93 + fVar88 * fVar88 + fVar19 * fVar19 + fVar85 * fVar85;
      auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
      fVar18 = auVar42._0_4_;
      auVar33 = ZEXT416((uint)(fVar18 * fVar18));
      fVar78 = fVar18 * 1.5 + fVar18 * fVar18 * fVar18 * fVar78 * -0.5;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar78 * fVar19));
      _local_178 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar78 * fVar19)),0x30);
      _local_158 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar78 * fVar85)),0x30);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),0x10);
      _local_188 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar78 * fVar93)),0x30);
      auVar47 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x3c)),0x20);
      _local_168 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar78 * fVar88)),0x30);
      auVar47 = ZEXT416((uint)(fVar78 * fVar93));
    }
    else {
      auVar47 = ZEXT816(0) << 0x20;
      if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar5 = pRVar4->ptr_ofs;
        lVar14 = pRVar4->stride * uVar13;
        _local_158 = *(undefined1 (*) [16])(pcVar5 + lVar14);
        _local_168 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x10);
        _local_188 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x20);
        _local_178 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x30);
        auVar47 = auVar57;
      }
    }
    pRVar4 = pRVar6 + (iVar15 + 1U);
    RVar2 = pRVar6[iVar15 + 1U].format;
    if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x10)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x20)),0x28);
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x14)),0x1c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),0x28);
      auVar47 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),0x1c);
      auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x28)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x1c)),0x1c);
      auVar33 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x2c)),0x28);
    }
    else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(pcVar5 + lVar14 + 4);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar36,0x4c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar47,auVar47,0x78);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),auVar37,0x4c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar47,auVar47,0x78);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
      auVar47 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar38,0x4c);
      auVar47 = vshufps_avx(auVar47,auVar47,0x78);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x28);
      auVar42 = vshufps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x24)),auVar39,0x4c);
      auVar33 = vshufps_avx(auVar42,auVar42,0x78);
    }
    else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x10);
      auVar47 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(pcVar5 + lVar14 + 8)),0x20);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x34);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14)),auVar54);
      auVar34 = vshufps_avx(auVar42,auVar54,0xd8);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)(pcVar5 + lVar14 + 0x1c);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x18)),auVar76);
      auVar41 = vshufps_avx(auVar42,auVar76,0xd8);
      fVar19 = *(float *)(pcVar5 + lVar14 + 0x24);
      fVar85 = *(float *)(pcVar5 + lVar14 + 0x28);
      fVar88 = *(float *)(pcVar5 + lVar14 + 0x2c);
      fVar93 = *(float *)(pcVar5 + lVar14 + 0x30);
      fVar78 = fVar93 * fVar93 + fVar88 * fVar88 + fVar19 * fVar19 + fVar85 * fVar85;
      auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
      fVar18 = auVar42._0_4_;
      fVar78 = fVar18 * 1.5 + fVar18 * fVar18 * fVar18 * fVar78 * -0.5;
      auVar33 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar78 * fVar19)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar34,ZEXT416((uint)(fVar78 * fVar85)),0x30);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)),0x10);
      auVar47 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar78 * fVar93)),0x30);
      auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0x3c)),0x20);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar42,ZEXT416((uint)(fVar78 * fVar88)),0x30);
    }
    else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar5 = pRVar4->ptr_ofs;
      lVar14 = uVar13 * pRVar4->stride;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar5 + lVar14))->v;
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar5 + lVar14 + 0x10))->v;
      auVar47 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x20);
      auVar33 = *(undefined1 (*) [16])(pcVar5 + lVar14 + 0x30);
    }
    auVar34 = vpermilps_avx(_local_178,0xff);
    auVar41 = vpermilps_avx(_local_158,0xff);
    auVar57 = vpermilps_avx(_local_168,0xff);
    auVar29 = vpermilps_avx(_local_188,0xff);
    local_128 = vshufps_avx(auVar33,auVar33,0xff);
    local_118 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
    auVar42 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
    local_e8 = vshufps_avx(auVar47,auVar47,0xff);
    fVar85 = auVar41._0_4_;
    fVar88 = auVar34._0_4_;
    fVar93 = auVar57._0_4_;
    fVar78 = auVar29._0_4_;
    fVar19 = fVar78 * local_e8._0_4_ +
             fVar93 * auVar42._0_4_ + fVar88 * local_128._0_4_ + fVar85 * local_118._0_4_;
    auVar55._0_4_ = -fVar19;
    auVar55._4_4_ = 0x80000000;
    auVar55._8_4_ = 0x80000000;
    auVar55._12_4_ = 0x80000000;
    auVar66._0_8_ = local_e8._0_8_ ^ 0x8000000080000000;
    auVar66._8_4_ = local_e8._8_4_ ^ 0x80000000;
    auVar66._12_4_ = local_e8._12_4_ ^ 0x80000000;
    if (fVar19 < auVar55._0_4_) {
      local_128._0_8_ = local_128._0_8_ ^ 0x8000000080000000;
      local_128._8_4_ = local_128._8_4_ ^ 0x80000000;
      local_128._12_4_ = local_128._12_4_ ^ 0x80000000;
      local_118._0_8_ = local_118._0_8_ ^ 0x8000000080000000;
      local_118._8_4_ = local_118._8_4_ ^ 0x80000000;
      local_118._12_4_ = local_118._12_4_ ^ 0x80000000;
      local_e8 = auVar66;
    }
    auVar60._8_4_ = 0x7fffffff;
    auVar60._0_8_ = 0x7fffffff7fffffff;
    auVar60._12_4_ = 0x7fffffff;
    auVar41 = ZEXT416((uint)fVar19);
    auVar34 = vandps_avx(auVar41,auVar60);
    fVar82 = auVar34._0_4_;
    uStack_130 = auVar42._8_4_;
    uStack_12c = auVar42._12_4_;
    auVar34 = vcmpss_avx(auVar41,auVar55,1);
    auVar41 = vmaxss_avx(auVar55,auVar41);
    fVar18 = auVar41._0_4_;
    fVar19 = 1.0 - fVar82;
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
    }
    else {
      auVar41 = vsqrtss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
      fVar19 = auVar41._0_4_;
    }
    auVar10._8_4_ = uStack_130 ^ 0x80000000;
    auVar10._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar10._12_4_ = uStack_12c ^ 0x80000000;
    auVar42 = vblendvps_avx(auVar42,auVar10,auVar34);
    auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,
                         ZEXT416((uint)(1.5707964 -
                                       fVar19 * (fVar82 * (fVar82 * (fVar82 * (fVar82 * (fVar82 * 
                                                  -0.0043095737 + 0.0192803) + -0.04489909) +
                                                  0.08785567) + -0.21450998) + 1.5707952))));
    auVar67._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
    auVar67._8_4_ = auVar41._8_4_ ^ 0x80000000;
    auVar67._12_4_ = auVar41._12_4_ ^ 0x80000000;
    auVar34 = vcmpss_avx(ZEXT416((uint)fVar18),ZEXT816(0) << 0x40,1);
    auVar34 = vblendvps_avx(auVar41,auVar67,auVar34);
    auVar41 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar82),1);
    auVar77._8_4_ = 0x7fc00000;
    auVar77._0_8_ = 0x7fc000007fc00000;
    auVar77._12_4_ = 0x7fc00000;
    auVar34 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar34._0_4_)),auVar77,auVar41);
    fVar83 = auVar34._0_4_ * fVar91;
    auVar34 = ZEXT416((uint)(fVar83 * 0.63661975));
    auVar34 = vroundss_avx(auVar34,auVar34,9);
    uVar16 = (uint)auVar34._0_4_;
    fVar83 = fVar83 - auVar34._0_4_ * 1.5707964;
    fVar82 = fVar83 * fVar83;
    uVar11 = uVar16 & 3;
    fVar19 = fVar82 * (fVar82 * (fVar82 * (fVar82 * (fVar82 * -2.5963018e-07 + 2.4756235e-05) +
                                          -0.001388833) + 0.04166664) + -0.5) + 1.0;
    fVar83 = fVar83 * (fVar82 * (fVar82 * (fVar82 * (fVar82 * (fVar82 * -2.5029328e-08 +
                                                              2.7600126e-06) + -0.00019842605) +
                                          0.008333348) + -0.16666667) + 1.0);
    fVar82 = fVar19;
    if ((uVar16 & 1) != 0) {
      fVar82 = fVar83;
      fVar83 = fVar19;
    }
    if (uVar11 - 1 < 2) {
      fVar82 = -fVar82;
    }
    fVar84 = fVar18 * fVar88 - (float)local_128._0_4_;
    fVar94 = fVar18 * fVar85 - (float)local_118._0_4_;
    fVar95 = fVar18 * fVar93 - auVar42._0_4_;
    fVar96 = fVar18 * fVar78 - (float)local_e8._0_4_;
    fVar19 = fVar96 * fVar96 + fVar95 * fVar95 + fVar84 * fVar84 + fVar94 * fVar94;
    auVar34 = vrsqrtss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
    fVar98 = auVar34._0_4_;
    fVar19 = fVar98 * 1.5 + fVar98 * fVar98 * fVar98 * fVar19 * -0.5;
    if (uVar11 < 2) {
      fVar83 = -fVar83;
    }
    fVar9 = 1.0 - fVar91;
    fVar89 = fVar9 * fVar88 + fVar91 * (float)local_128._0_4_;
    fVar90 = fVar9 * fVar85 + fVar91 * (float)local_118._0_4_;
    fVar7 = fVar93 * fVar9 + fVar91 * auVar42._0_4_;
    fVar91 = fVar78 * fVar9 + fVar91 * (float)local_e8._0_4_;
    fVar98 = fVar91 * fVar91 + fVar7 * fVar7 + fVar89 * fVar89 + fVar90 * fVar90;
    auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98));
    fVar99 = auVar42._0_4_;
    fVar98 = fVar99 * 1.5 + fVar99 * fVar99 * fVar99 * fVar98 * -0.5;
    if (0.9995 < fVar18) {
      fVar89 = fVar89 * fVar98;
      fVar90 = fVar90 * fVar98;
      fVar7 = fVar7 * fVar98;
    }
    else {
      fVar89 = fVar82 * fVar88 + fVar19 * fVar84 * fVar83;
      fVar90 = fVar82 * fVar85 + fVar19 * fVar94 * fVar83;
      fVar7 = fVar93 * fVar82 + fVar19 * fVar95 * fVar83;
    }
    auVar42 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar18),1);
    auVar42 = vblendvps_avx(ZEXT416((uint)(fVar78 * fVar82 + fVar19 * fVar96 * fVar83)),
                            ZEXT416((uint)(fVar98 * fVar91)),auVar42);
    auVar34 = vpermilps_avx(auVar26,0);
    local_58 = a0.field_0._0_4_;
    fStack_54 = a0.field_0._4_4_;
    fStack_50 = a0.field_0._8_4_;
    fStack_4c = a0.field_0._12_4_;
    fVar19 = auVar34._0_4_;
    fVar91 = auVar34._4_4_;
    fVar85 = auVar34._8_4_;
    fVar88 = auVar34._12_4_;
    auVar34 = vshufps_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),0);
    fVar93 = auVar34._0_4_;
    fVar78 = auVar34._4_4_;
    fVar18 = auVar34._8_4_;
    fVar82 = auVar34._12_4_;
    local_1a8._4_4_ = fVar78 * (float)local_158._4_4_ + fVar91 * fStack_54;
    local_1a8._0_4_ = fVar93 * (float)local_158._0_4_ + fVar19 * local_58;
    uStack_1a0._0_4_ = fVar18 * fStack_150 + fVar85 * fStack_50;
    uStack_1a0._4_4_ = fVar82 * fStack_14c + fVar88 * fStack_4c;
    local_68 = b0.field_0._0_4_;
    fStack_64 = b0.field_0._4_4_;
    fStack_60 = b0.field_0._8_4_;
    fStack_5c = b0.field_0._12_4_;
    auVar68._0_4_ = fVar93 * (float)local_168._0_4_ + fVar19 * local_68;
    auVar68._4_4_ = fVar78 * (float)local_168._4_4_ + fVar91 * fStack_64;
    auVar68._8_4_ = fVar18 * fStack_160 + fVar85 * fStack_60;
    auVar68._12_4_ = fVar82 * fStack_15c + fVar88 * fStack_5c;
    local_88 = auVar47._0_4_;
    fStack_84 = auVar47._4_4_;
    fStack_80 = auVar47._8_4_;
    fStack_7c = auVar47._12_4_;
    auVar61._0_4_ = fVar93 * (float)local_188._0_4_ + fVar19 * local_88;
    auVar61._4_4_ = fVar78 * (float)local_188._4_4_ + fVar91 * fStack_84;
    auVar61._8_4_ = fVar18 * fStack_180 + fVar85 * fStack_80;
    auVar61._12_4_ = fVar82 * fStack_17c + fVar88 * fStack_7c;
    local_78 = auVar33._0_4_;
    fStack_74 = auVar33._4_4_;
    fStack_70 = auVar33._8_4_;
    fStack_6c = auVar33._12_4_;
    auVar56._0_4_ = fVar93 * (float)local_178._0_4_ + fVar19 * local_78;
    auVar56._4_4_ = fVar78 * (float)local_178._4_4_ + fVar91 * fStack_74;
    auVar56._8_4_ = fVar18 * fStack_170 + fVar85 * fStack_70;
    auVar56._12_4_ = fVar82 * fStack_16c + fVar88 * fStack_6c;
    fVar96 = auVar42._0_4_;
    fVar19 = fVar90 * fVar7 + fVar96 * fVar89;
    fVar88 = fVar90 * fVar7 - fVar96 * fVar89;
    fVar93 = fVar89 * fVar89 - fVar90 * fVar90;
    fVar78 = fVar96 * fVar90 - fVar89 * fVar7;
    fVar91 = fVar96 * fVar90 + fVar89 * fVar7;
    fVar85 = fVar96 * fVar7 + fVar89 * fVar90;
    fVar18 = fVar96 * fVar7 - fVar89 * fVar90;
    auVar47 = ZEXT416((uint)(-fVar96 * fVar96 + -fVar7 * fVar7 + fVar89 * fVar89 + fVar90 * fVar90))
    ;
    auVar47 = vshufps_avx(auVar47,auVar47,0);
    auVar42 = ZEXT416((uint)(fVar19 + fVar19));
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar34 = ZEXT416((uint)(fVar78 + fVar78));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    fVar78 = auVar47._0_4_ * 1.0 + auVar42._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
    fVar82 = auVar47._4_4_ * 0.0 + auVar42._4_4_ * 1.0 + auVar34._4_4_ * 0.0;
    fVar83 = auVar47._8_4_ * 0.0 + auVar42._8_4_ * 0.0 + auVar34._8_4_ * 1.0;
    fVar84 = auVar47._12_4_ * 0.0 + auVar42._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
    auVar47 = ZEXT416((uint)(-fVar96 * fVar96 + fVar7 * fVar7 + fVar93));
    auVar47 = vshufps_avx(auVar47,auVar47,0);
    auVar42 = ZEXT416((uint)(fVar85 + fVar85));
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar34 = ZEXT416((uint)(fVar88 + fVar88));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    fVar85 = auVar34._0_4_ * 1.0 + auVar42._0_4_ * 0.0 + auVar47._0_4_ * 0.0;
    fVar88 = auVar34._4_4_ * 0.0 + auVar42._4_4_ * 0.0 + auVar47._4_4_ * 1.0;
    fVar94 = auVar34._8_4_ * 0.0 + auVar42._8_4_ * 1.0 + auVar47._8_4_ * 0.0;
    fVar95 = auVar34._12_4_ * 0.0 + auVar42._12_4_ * 0.0 + auVar47._12_4_ * 0.0;
    auVar47 = ZEXT416((uint)(fVar96 * fVar96 + -fVar7 * fVar7 + fVar93));
    auVar42 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = ZEXT416((uint)(fVar18 + fVar18));
    auVar34 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = ZEXT416((uint)(fVar91 + fVar91));
    auVar41 = vshufps_avx(auVar47,auVar47,0);
    auVar47 = vshufps_avx(_local_1a8,ZEXT416(0) << 0x20,0xe9);
    auVar47 = vblendps_avx(auVar47,auVar68,4);
    fVar91 = auVar41._0_4_ * 1.0 + auVar34._0_4_ * 0.0 + auVar42._0_4_ * 0.0;
    fVar93 = auVar41._4_4_ * 0.0 + auVar34._4_4_ * 1.0 + auVar42._4_4_ * 0.0;
    fVar89 = auVar41._8_4_ * 0.0 + auVar34._8_4_ * 0.0 + auVar42._8_4_ * 1.0;
    fVar90 = auVar41._12_4_ * 0.0 + auVar34._12_4_ * 0.0 + auVar42._12_4_ * 0.0;
    fVar18 = auVar47._0_4_;
    fVar96 = auVar47._4_4_;
    fVar98 = auVar47._8_4_;
    fVar19 = auVar47._12_4_;
    auVar47 = vshufps_avx(_local_1a8,_local_1a8,0);
    auVar26._0_4_ = auVar47._0_4_ * fVar78 + fVar85 * 0.0 + fVar91 * 0.0;
    auVar26._4_4_ = auVar47._4_4_ * fVar82 + fVar88 * 0.0 + fVar93 * 0.0;
    auVar26._8_4_ = auVar47._8_4_ * fVar83 + fVar94 * 0.0 + fVar89 * 0.0;
    auVar26._12_4_ = auVar47._12_4_ * fVar84 + fVar95 * 0.0 + fVar90 * 0.0;
    auVar47 = vshufps_avx(auVar68,auVar68,0);
    auVar42 = vshufps_avx(auVar68,auVar68,0x55);
    a0.field_0._0_4_ = auVar47._0_4_ * fVar78 + auVar42._0_4_ * fVar85 + fVar91 * 0.0;
    a0.field_0._4_4_ = auVar47._4_4_ * fVar82 + auVar42._4_4_ * fVar88 + fVar93 * 0.0;
    a0.field_0._8_4_ = auVar47._8_4_ * fVar83 + auVar42._8_4_ * fVar94 + fVar89 * 0.0;
    a0.field_0._12_4_ = auVar47._12_4_ * fVar84 + auVar42._12_4_ * fVar95 + fVar90 * 0.0;
    auVar47 = vshufps_avx(auVar61,auVar61,0x55);
    auVar42 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar34 = vshufps_avx(auVar61,auVar61,0);
    auVar41._0_4_ = auVar34._0_4_ * fVar78 + auVar47._0_4_ * fVar85 + fVar91 * auVar42._0_4_;
    auVar41._4_4_ = auVar34._4_4_ * fVar82 + auVar47._4_4_ * fVar88 + fVar93 * auVar42._4_4_;
    auVar41._8_4_ = auVar34._8_4_ * fVar83 + auVar47._8_4_ * fVar94 + fVar89 * auVar42._8_4_;
    auVar41._12_4_ = auVar34._12_4_ * fVar84 + auVar47._12_4_ * fVar95 + fVar90 * auVar42._12_4_;
    auVar47 = vshufps_avx(auVar56,auVar56,0xaa);
    auVar42 = vshufps_avx(auVar56,auVar56,0x55);
    fVar91 = auVar42._0_4_ * fVar85 + fVar91 * auVar47._0_4_;
    fVar85 = auVar42._4_4_ * fVar88 + fVar93 * auVar47._4_4_;
    fVar88 = auVar42._8_4_ * fVar94 + fVar89 * auVar47._8_4_;
    fVar93 = auVar42._12_4_ * fVar95 + fVar90 * auVar47._12_4_;
    auVar42 = vshufps_avx(auVar56,auVar56,0);
  }
  auVar47._0_4_ = fVar18 + 0.0 + auVar42._0_4_ * fVar78 + fVar91;
  auVar47._4_4_ = fVar96 + 0.0 + auVar42._4_4_ * fVar82 + fVar85;
  auVar47._8_4_ = fVar98 + 0.0 + auVar42._8_4_ * fVar83 + fVar88;
  auVar47._12_4_ = fVar19 + 0.0 + auVar42._12_4_ * fVar84 + fVar93;
LAB_010a06e3:
  auVar42 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar34 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar86._0_4_ = auVar41._0_4_ * auVar34._0_4_;
  auVar86._4_4_ = auVar41._4_4_ * auVar34._4_4_;
  auVar86._8_4_ = auVar41._8_4_ * auVar34._8_4_;
  auVar86._12_4_ = auVar41._12_4_ * auVar34._12_4_;
  auVar92._0_4_ = a0.field_0._0_4_ * auVar42._0_4_;
  auVar92._4_4_ = a0.field_0._4_4_ * auVar42._4_4_;
  auVar92._8_4_ = a0.field_0._8_4_ * auVar42._8_4_;
  auVar92._12_4_ = a0.field_0._12_4_ * auVar42._12_4_;
  auVar29 = vsubps_avx(auVar92,auVar86);
  auVar33 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar57 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar64._0_4_ = auVar42._0_4_ * auVar26._0_4_;
  auVar64._4_4_ = auVar42._4_4_ * auVar26._4_4_;
  auVar64._8_4_ = auVar42._8_4_ * auVar26._8_4_;
  auVar64._12_4_ = auVar42._12_4_ * auVar26._12_4_;
  auVar59._0_4_ = auVar57._0_4_ * auVar41._0_4_;
  auVar59._4_4_ = auVar57._4_4_ * auVar41._4_4_;
  auVar59._8_4_ = auVar57._8_4_ * auVar41._8_4_;
  auVar59._12_4_ = auVar57._12_4_ * auVar41._12_4_;
  auVar41 = vsubps_avx(auVar59,auVar64);
  auVar65._0_4_ = auVar57._0_4_ * a0.field_0._0_4_;
  auVar65._4_4_ = auVar57._4_4_ * a0.field_0._4_4_;
  auVar65._8_4_ = auVar57._8_4_ * a0.field_0._8_4_;
  auVar65._12_4_ = auVar57._12_4_ * a0.field_0._12_4_;
  auVar73._0_4_ = auVar26._0_4_ * auVar34._0_4_;
  auVar73._4_4_ = auVar26._4_4_ * auVar34._4_4_;
  auVar73._8_4_ = auVar26._8_4_ * auVar34._8_4_;
  auVar73._12_4_ = auVar26._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar73,auVar65);
  auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar57 = vunpcklps_avx(auVar33,auVar42);
  auVar42 = vunpcklps_avx(auVar29,auVar34);
  auVar34 = vinsertps_avx(auVar41,auVar41,0x4a);
  auVar29 = vunpcklps_avx(auVar42,ZEXT416(auVar41._0_4_));
  auVar42 = vdpps_avx(auVar26,auVar33,0x7f);
  auVar33 = vunpcklps_avx(auVar57,auVar34);
  auVar34 = vunpckhps_avx(auVar57,auVar34);
  auVar41 = vshufps_avx(auVar42,auVar42,0);
  auVar42 = vdivps_avx(auVar33,auVar41);
  auVar34 = vdivps_avx(auVar34,auVar41);
  auVar41 = vdivps_avx(auVar29,auVar41);
  auVar33 = vshufps_avx(auVar47,auVar47,0);
  auVar26 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar88 = auVar41._0_4_;
  fVar18 = auVar41._4_4_;
  fVar84 = auVar41._8_4_;
  fVar96 = auVar41._12_4_;
  fVar93 = auVar34._0_4_;
  fVar82 = auVar34._4_4_;
  fVar94 = auVar34._8_4_;
  fVar98 = auVar34._12_4_;
  fVar78 = auVar42._0_4_;
  fVar83 = auVar42._4_4_;
  fVar95 = auVar42._8_4_;
  fVar89 = auVar42._12_4_;
  auVar48._0_4_ = auVar33._0_4_ * fVar78 + auVar26._0_4_ * fVar93 + auVar47._0_4_ * fVar88;
  auVar48._4_4_ = auVar33._4_4_ * fVar83 + auVar26._4_4_ * fVar82 + auVar47._4_4_ * fVar18;
  auVar48._8_4_ = auVar33._8_4_ * fVar95 + auVar26._8_4_ * fVar94 + auVar47._8_4_ * fVar84;
  auVar48._12_4_ = auVar33._12_4_ * fVar89 + auVar26._12_4_ * fVar98 + auVar47._12_4_ * fVar96;
  auVar47 = *(undefined1 (*) [16])(ray->org).field_0.m128;
  auVar42 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
  fVar19 = (ray->org).field_0.m128[0];
  fVar91 = (ray->org).field_0.m128[1];
  fVar85 = (ray->org).field_0.m128[2];
  auVar87._0_4_ = fVar85 * fVar88;
  auVar87._4_4_ = fVar85 * fVar18;
  auVar87._8_4_ = fVar85 * fVar84;
  auVar87._12_4_ = fVar85 * fVar96;
  auVar34 = vsubps_avx(auVar87,auVar48);
  auVar49._0_4_ = fVar19 * fVar78 + fVar91 * fVar93 + auVar34._0_4_;
  auVar49._4_4_ = fVar19 * fVar83 + fVar91 * fVar82 + auVar34._4_4_;
  auVar49._8_4_ = fVar19 * fVar95 + fVar91 * fVar94 + auVar34._8_4_;
  auVar49._12_4_ = fVar19 * fVar89 + fVar91 * fVar98 + auVar34._12_4_;
  aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar49,auVar47,8);
  (ray->org).field_0 = aVar8;
  fVar19 = (ray->dir).field_0.m128[0];
  fVar91 = (ray->dir).field_0.m128[1];
  fVar85 = (ray->dir).field_0.m128[2];
  auVar27._0_4_ = fVar19 * fVar78 + fVar91 * fVar93 + fVar85 * fVar88;
  auVar27._4_4_ = fVar19 * fVar83 + fVar91 * fVar82 + fVar85 * fVar18;
  auVar27._8_4_ = fVar19 * fVar95 + fVar91 * fVar94 + fVar85 * fVar84;
  auVar27._12_4_ = fVar19 * fVar89 + fVar91 * fVar98 + fVar85 * fVar96;
  aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar27,auVar42,8);
  (ray->dir).field_0 = aVar8;
  (**(code **)&pAVar12->field_0x80)(&(pAVar12->super_AccelData).field_0x58,ray);
  local_1a8 = auVar47._0_8_;
  uStack_1a0 = auVar47._8_8_;
  *(undefined1 (*) [8])&(ray->org).field_0 = local_1a8;
  *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_1a0;
  local_148 = auVar42._0_8_;
  uStack_140 = auVar42._8_8_;
  *(undefined8 *)&(ray->dir).field_0 = local_148;
  *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_140;
  fVar19 = ray->tfar;
  pRVar3->instID[0] = 0xffffffff;
  pRVar3->instPrimID[0] = 0xffffffff;
  return fVar19 < 0.0;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }